

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.h
# Opt level: O2

void __thiscall
sigslot::_signal_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>::~_signal_base1
          (_signal_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local> *this)

{
  (this->super__signal_base<sigslot::multi_threaded_local>).super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR___signal_base1_001c1f20;
  disconnect_all(this);
  std::__cxx11::
  _List_base<sigslot::_connection_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>_*>_>
  ::_M_clear(&(this->m_connected_slots).
              super__List_base<sigslot::_connection_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>_*>_>
            );
  multi_threaded_local::~multi_threaded_local((multi_threaded_local *)this);
  return;
}

Assistant:

~_signal_base1()
		{
			disconnect_all();
		}